

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O1

int bf_hex_dump(bfile_t *bfile,FILE *file,uint n_bytes,uint unit_size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ushort **ppuVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  char line [256];
  char ascii [256];
  char format [256];
  char buffer [256];
  char local_438 [256];
  byte local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  uVar2 = (ulong)n_bytes;
  local_438[0] = '\0';
  uVar8 = bfile->size - bfile->pos;
  uVar4 = uVar2;
  if (uVar8 < uVar2) {
    uVar4 = uVar8;
  }
  if (uVar4 != 0) {
    uVar7 = 0;
    do {
      sprintf(local_438,"0x%06x:  ",(ulong)(uint)bfile->pos);
      uVar9 = 0;
      uVar10 = 0;
      iVar14 = 0;
      uVar11 = 0;
LAB_0010c68d:
      do {
        uVar12 = (ulong)uVar11;
        if (uVar7 + uVar12 < uVar4) {
          uVar9 = uVar9 << 8 | 0xff;
          bVar3 = bf_get_uint8(bfile);
          uVar10 = uVar10 << 8 | (uint)bVar3;
          local_338[uVar12] = 0x2e;
          ppuVar5 = __ctype_b_loc();
          if (((*ppuVar5)[bVar3] >> 0xe & 1) == 0) {
            bVar3 = 0x2e;
          }
          local_338[uVar12] = bVar3;
          uVar11 = uVar11 + 1;
          iVar14 = iVar14 + 1;
          if (iVar14 != 3) goto LAB_0010c68d;
          iVar14 = 3;
        }
        uVar10 = uVar10 & uVar9;
        uVar9 = 0;
        sprintf(local_238,"%%0%dx ",(ulong)(uint)(iVar14 * 2));
        sprintf(local_138,local_238,(ulong)uVar10);
        strcat(local_438,local_138);
        uVar13 = (ulong)uVar11;
        uVar12 = uVar7 + uVar13;
        if (0xe < uVar11) break;
        uVar10 = 0;
        iVar14 = 0;
      } while (uVar12 < uVar4);
      if ((uVar11 < 0xf) &&
         (auVar1._8_8_ = 0, auVar1._0_8_ = 0x12 - uVar13,
         lVar15 = SUB168(auVar1 * ZEXT816(0x5555555555555556),8) + uVar13 * -2, lVar15 != -0x1d)) {
        uVar9 = 1;
        do {
          sVar6 = strlen(local_438);
          (local_438 + sVar6)[0] = ' ';
          (local_438 + sVar6)[1] = '\0';
          uVar7 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
        } while (uVar7 < lVar15 + 0x1dU);
      }
      local_338[uVar13] = 0;
      sVar6 = strlen(local_438);
      local_438[sVar6 + 2] = '\0';
      (local_438 + sVar6)[0] = ' ';
      (local_438 + sVar6)[1] = '\"';
      strcat(local_438,(char *)local_338);
      sVar6 = strlen(local_438);
      (local_438 + sVar6)[0] = '\"';
      (local_438 + sVar6)[1] = '\0';
      fprintf((FILE *)file,"%s\n",local_438);
      uVar7 = uVar12;
    } while (uVar12 < uVar4);
  }
  if (uVar8 < uVar2) {
    fprintf((FILE *)file,"0x%06x:  [reached end of file]\n",(ulong)(uint)bfile->pos);
  }
  return (int)uVar4;
}

Assistant:

int
bf_hex_dump(
    bfile_t * bfile,
    FILE * file,
    unsigned int n_bytes,
    unsigned int unit_size )
{
    char line[ 256 ];
    char ascii[ 256 ];
    char buffer[ 256 ];
    char format[ 256 ];
    bool_t eof;

    unsigned int i, j;
    size_t bytes, bytes_per_line, num_bytes = n_bytes;

    unit_size = 3;

    line[0] = '\0';
    eof = FALSE;

    if ( bf_get_remaining_length( bfile ) < num_bytes ) {
        num_bytes = bf_get_remaining_length( bfile );
        eof = TRUE;
    }

    bytes_per_line = 16;
    bytes_per_line -= (bytes_per_line%unit_size);

    bytes = 0;
    while ( bytes < num_bytes ) {
        sprintf( line, "0x%06x:  ", (unsigned int)bf_get_position( bfile ) );
        i = 0;
        while ( (i < bytes_per_line) && ((bytes + i) < num_bytes) ) {
            uint32_t word;
            uint32_t mask;
            word = 0; mask = 0;
            for ( j = 0; j < unit_size && (bytes + i) < num_bytes; j++ ) {
                word <<= 8;
                mask <<= 8; mask += 0xff;
                word += bf_get_uint8( bfile );
                ascii[i] = '.';
                if ( isprint( word & 0xff ) )
                    ascii[i] = word & 0xff;
                i++;
            }
            sprintf( format, "%%0%dx ", j * 2 );
            sprintf( buffer, format, (word & mask) );
            strcat( line, buffer );
        }
        if ( i < bytes_per_line ) {
            size_t pad;
            pad = ((bytes_per_line - i + unit_size) / unit_size) - 1 +
                  2 * (bytes_per_line - i);
            for ( j = 0; j < pad; j++ ) 
                strcat( line, " " );
        }
        ascii[i] = '\0';
        strcat( line, " \"" );
        strcat( line, ascii );
        strcat( line, "\"" );
        fprintf( file, "%s\n", line );
        bytes += i;
    }
    if ( eof != FALSE )
        fprintf( file, "0x%06x:  [reached end of file]\n",
            (unsigned int)bf_get_position( bfile ) );
    
    return (int)num_bytes;
}